

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int do_sign(EVP_PKEY *key,st_ptls_openssl_signature_scheme_t *scheme,ptls_buffer_t *outbuf,
           ptls_iovec_t input)

{
  undefined8 in_RCX;
  long *in_RDX;
  long in_RSI;
  EVP_PKEY *in_RDI;
  undefined8 in_R8;
  int ret;
  size_t siglen;
  EVP_PKEY_CTX *pkey_ctx;
  EVP_MD *md;
  EVP_MD_CTX *ctx;
  EVP_MD *local_58;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar1;
  ptls_buffer_t *in_stack_ffffffffffffffb8;
  EVP_PKEY_CTX *local_40;
  EVP_MD *local_38;
  EVP_MD_CTX *local_30;
  long *local_28;
  EVP_PKEY *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_30 = (EVP_MD_CTX *)0x0;
  local_28 = in_RDX;
  local_18 = in_RDI;
  local_10 = in_RCX;
  local_8 = in_R8;
  if (*(long *)(in_RSI + 8) == 0) {
    local_58 = (EVP_MD *)0x0;
  }
  else {
    local_58 = (EVP_MD *)(**(code **)(in_RSI + 8))();
  }
  local_38 = local_58;
  local_30 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (local_30 == (EVP_MD_CTX *)0x0) {
    iVar1 = 0x201;
  }
  else {
    iVar1 = EVP_DigestSignInit(local_30,&local_40,local_38,(ENGINE *)0x0,local_18);
    if (iVar1 == 1) {
      iVar1 = EVP_PKEY_get_id(local_18);
      if (iVar1 == 0x43f) {
        iVar1 = EVP_DigestSign(local_30,0,&stack0xffffffffffffffb8,local_10,local_8);
        if (iVar1 != 1) {
          iVar1 = 0x203;
          goto LAB_001070d0;
        }
        iVar1 = ptls_buffer_reserve(in_stack_ffffffffffffffb8,
                                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        if (iVar1 != 0) goto LAB_001070d0;
        iVar1 = EVP_DigestSign(local_30,*local_28 + local_28[2],&stack0xffffffffffffffb8,local_10,
                               local_8);
        if (iVar1 != 1) {
          iVar1 = 0x203;
          goto LAB_001070d0;
        }
      }
      else {
        iVar1 = EVP_PKEY_get_id(local_18);
        if (iVar1 == 6) {
          iVar1 = EVP_PKEY_CTX_set_rsa_padding(local_40,6);
          if (iVar1 != 1) {
            iVar1 = 0x203;
            goto LAB_001070d0;
          }
          iVar1 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_40,0xffffffff);
          if (iVar1 != 1) {
            iVar1 = 0x203;
            goto LAB_001070d0;
          }
          iVar1 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_40,local_38);
          if (iVar1 != 1) {
            iVar1 = 0x203;
            goto LAB_001070d0;
          }
        }
        iVar1 = EVP_DigestSignUpdate(local_30,local_10,local_8);
        if (iVar1 != 1) {
          iVar1 = 0x203;
          goto LAB_001070d0;
        }
        iVar1 = EVP_DigestSignFinal(local_30,(uchar *)0x0,(size_t *)&stack0xffffffffffffffb8);
        if (iVar1 != 1) {
          iVar1 = 0x203;
          goto LAB_001070d0;
        }
        iVar1 = ptls_buffer_reserve(in_stack_ffffffffffffffb8,
                                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        if (iVar1 != 0) goto LAB_001070d0;
        iVar1 = EVP_DigestSignFinal(local_30,(uchar *)(*local_28 + local_28[2]),
                                    (size_t *)&stack0xffffffffffffffb8);
        if (iVar1 != 1) {
          iVar1 = 0x203;
          goto LAB_001070d0;
        }
      }
      local_28[2] = (long)&in_stack_ffffffffffffffb8->base + local_28[2];
      iVar1 = 0;
    }
    else {
      iVar1 = 0x203;
    }
  }
LAB_001070d0:
  if (local_30 != (EVP_MD_CTX *)0x0) {
    EVP_MD_CTX_free(local_30);
  }
  return iVar1;
}

Assistant:

static int do_sign(EVP_PKEY *key, const struct st_ptls_openssl_signature_scheme_t *scheme, ptls_buffer_t *outbuf,
                   ptls_iovec_t input)
{
    EVP_MD_CTX *ctx = NULL;
    const EVP_MD *md = scheme->scheme_md != NULL ? scheme->scheme_md() : NULL;
    EVP_PKEY_CTX *pkey_ctx;
    size_t siglen;
    int ret;

    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    if (EVP_DigestSignInit(ctx, &pkey_ctx, md, NULL, key) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

#if PTLS_OPENSSL_HAVE_ED25519
    if (EVP_PKEY_id(key) == EVP_PKEY_ED25519) {
        /* ED25519 requires the use of the all-at-once function that appeared in OpenSSL 1.1.1, hence different path */
        if (EVP_DigestSign(ctx, NULL, &siglen, input.base, input.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if ((ret = ptls_buffer_reserve(outbuf, siglen)) != 0)
            goto Exit;
        if (EVP_DigestSign(ctx, outbuf->base + outbuf->off, &siglen, input.base, input.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    } else
#endif
    {
        if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
            if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, md) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
        }
        if (EVP_DigestSignUpdate(ctx, input.base, input.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestSignFinal(ctx, NULL, &siglen) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if ((ret = ptls_buffer_reserve(outbuf, siglen)) != 0)
            goto Exit;
        if (EVP_DigestSignFinal(ctx, outbuf->base + outbuf->off, &siglen) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    }

    outbuf->off += siglen;

    ret = 0;
Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    return ret;
}